

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mul.h
# Opt level: O0

void __thiscall
mp::
QCConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_0>
::LinearizeQPTerms(QCConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_0>
                   *this,ItemType *qc)

{
  QuadAndLinTerms *this_00;
  size_t sVar1;
  LinTerms *pLVar2;
  AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_> *in_RSI;
  LinTerms *in_RDI;
  NodeRange NVar3;
  int y;
  int x;
  double c;
  int i;
  QuadTerms *qp_terms;
  LinTerms lin_terms;
  QuadAndLinTerms *body;
  undefined1 in_stack_00000daf;
  LinTerms *in_stack_00000db0;
  size_t in_stack_fffffffffffffd68;
  QuadTerms *in_stack_fffffffffffffd70;
  LinTerms *in_stack_fffffffffffffd78;
  LinTerms *in_stack_fffffffffffffd80;
  undefined4 in_stack_fffffffffffffd88;
  int iVar4;
  undefined1 fSort;
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_> *in_stack_fffffffffffffd98;
  AlgConRhs<0> in_stack_fffffffffffffda0;
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_> *in_stack_fffffffffffffe38;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *in_stack_fffffffffffffe40;
  undefined4 local_9c;
  
  this_00 = AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>::GetBody(in_RSI);
  QuadAndLinTerms::GetLinTerms(this_00);
  LinTerms::LinTerms(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
  QuadAndLinTerms::GetQPTerms(this_00);
  local_9c = 0;
  while( true ) {
    iVar4 = local_9c;
    sVar1 = QuadTerms::size((QuadTerms *)0x1db04e);
    if ((int)sVar1 <= iVar4) break;
    in_stack_fffffffffffffd80 =
         (LinTerms *)
         QuadTerms::coef(in_stack_fffffffffffffd70,(int)(in_stack_fffffffffffffd68 >> 0x20));
    QuadTerms::var1(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
    QuadTerms::var2(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
    LinearizeQPTerm((QCConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_0>
                     *)CONCAT44(iVar4,in_stack_fffffffffffffd88),(double)in_stack_fffffffffffffd80,
                    (int)((ulong)in_stack_fffffffffffffd78 >> 0x20),(int)in_stack_fffffffffffffd78);
    LinTerms::add(in_RDI,(LinTerms *)CONCAT44(iVar4,in_stack_fffffffffffffd88));
    LinTerms::~LinTerms((LinTerms *)in_stack_fffffffffffffd70);
    local_9c = local_9c + 1;
  }
  LinTerms::sort_terms(in_stack_00000db0,(bool)in_stack_00000daf);
  fSort = (undefined1)((uint)iVar4 >> 0x18);
  pLVar2 = (LinTerms *)
           BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           ::GetMC((BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                    *)in_RDI);
  LinTerms::LinTerms(in_stack_fffffffffffffd80,pLVar2);
  AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>::GetRhsOrRange(in_RSI);
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>::AlgebraicConstraint
            (in_stack_fffffffffffffd98,in_RDI,in_stack_fffffffffffffda0,(bool)fSort);
  NVar3 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
          ::AddConstraint_AS_ROOT<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<0>>>
                    (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>::~AlgebraicConstraint
            ((AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_> *)NVar3.pvn_);
  LinTerms::~LinTerms((LinTerms *)NVar3.pvn_);
  LinTerms::~LinTerms((LinTerms *)NVar3.pvn_);
  return;
}

Assistant:

void LinearizeQPTerms(const ItemType& qc) {
    const auto& body = qc.GetBody();
    // Copy lin terms
    auto lin_terms = body.GetLinTerms();
    // Convert quadratic terms
    const auto& qp_terms = body.GetQPTerms();
    for (int i=0; i<(int)qp_terms.size(); ++i) {
      auto c = qp_terms.coef(i);
      auto x = qp_terms.var1(i);
      auto y = qp_terms.var2(i);
      lin_terms.add( LinearizeQPTerm(c, x, y) );
    }
    // Sort linear body. AS_ROOT propagates context
    lin_terms.sort_terms();
    GetMC().AddConstraint_AS_ROOT( LinConRhs< sens >{
                             lin_terms, qc.GetRhsOrRange() } );
  }